

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

void fp_abort_output(fitsfile *infptr,fitsfile *outfptr,int stat)

{
  int status;
  int hdunum;
  char msg [513];
  int local_240;
  uint local_23c;
  char local_238 [520];
  
  local_240 = 0;
  if (infptr == (fitsfile *)0x0) {
    builtin_strncpy(local_238,"Error: Unable to process input file\n",0x25);
  }
  else {
    ffflnm(infptr,tempfilename,&local_240);
    ffghdn(infptr,(int *)&local_23c);
    ffclos(infptr,&local_240);
    snprintf(local_238,0x201,"Error processing file: %s\n",tempfilename);
    printf("%s",local_238);
    snprintf(local_238,0x201,"  in HDU number %d\n",(ulong)local_23c);
  }
  printf("%s",local_238);
  ffrprt(_stderr,stat);
  if (outfptr != (fitsfile *)0x0) {
    ffdelt(outfptr,&local_240);
    puts("Input file is unchanged.");
  }
  exit(stat);
}

Assistant:

void fp_abort_output (fitsfile *infptr, fitsfile *outfptr, int stat)
{
	int status = 0, hdunum;
	char  msg[SZ_STR];

        if (infptr)
        {
	   fits_file_name(infptr, tempfilename, &status);
	   fits_get_hdu_num(infptr, &hdunum);

           fits_close_file (infptr, &status);

	   snprintf(msg, SZ_STR,"Error processing file: %s\n", tempfilename);
	   fp_msg (msg);
	   snprintf(msg, SZ_STR,"  in HDU number %d\n", hdunum);
	   fp_msg (msg);
        }
        else
        {
           snprintf(msg, SZ_STR,"Error: Unable to process input file\n");
           fp_msg(msg);
        }
	fits_report_error (stderr, stat);

	if (outfptr) {
	    fits_delete_file(outfptr, &status);
	    fp_msg ("Input file is unchanged.\n");
	}

	exit (stat); 
}